

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

bool __thiscall progress::update(progress *this,uint64_t delta,bool force)

{
  long lVar1;
  long lVar2;
  time_duration_type tVar3;
  ostream *poVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  uint64_t uVar8;
  float fVar9;
  float local_48;
  ptime now;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  if (show_progress) {
    uVar7 = delta + this->value;
    bVar6 = progress_cleared ^ 1 | force;
    this->value = uVar7;
    uVar5 = this->max;
    if (uVar5 == 0) {
      local_48 = 0.0;
    }
    else {
      if (uVar5 < uVar7) {
        uVar7 = uVar5;
      }
      fVar9 = ((float)uVar7 * 1000.0) / (float)uVar5;
      uVar5 = (ulong)fVar9;
      local_48 = (float)((long)(fVar9 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5) * 0.001;
      if (local_48 == this->last_status && (bVar6 & 1) == 0) {
        return false;
      }
    }
    now = boost::date_time::microsec_clock<boost::posix_time::ptime>::universal_time();
    tVar3 = boost::date_time::
            counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
            ::subtract_times((time_rep_type *)&now,(time_rep_type *)&this->start_time);
    if (((bVar6 & 1) != 0) ||
       (49999 < (long)tVar3.
                      super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                      .ticks_.value_ - this->last_time)) {
      this->last_time =
           (uint64_t)
           tVar3.
           super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
           .ticks_.value_;
      this->last_status = local_48;
      uVar8 = this->max;
      if ((uVar8 == 0) &&
         (local_48 = fmodf((float)(ulong)tVar3.
                                         super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                                         .ticks_.value_ * 2e-07,2.0), 1.0 < local_48)) {
        local_48 = 2.0 - local_48;
      }
      if (((this->show_rate == true) &&
          (tVar3.
           super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
           .ticks_.value_ != (impl_type)0x0 && 0x27ff < this->value)) &&
         (fVar9 = ((float)this->value * 1e+06) /
                  (float)(ulong)tVar3.
                                super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                                .ticks_.value_, fVar9 != this->last_rate)) {
        this->last_rate = fVar9;
        now.
        super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
        .time_.time_count_.value_ =
             (base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
              )&local_30;
        local_30._M_local_buf[0] = '\0';
        std::__cxx11::stringbuf::str((string *)&this->field_0x40);
        std::__cxx11::string::~string((string *)&now);
        lVar1 = *(long *)&this->label;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(&this->field_0x50 + lVar2) =
             *(uint *)(&this->field_0x50 + lVar2) & 0xffffff4f | 0x80;
        lVar1 = *(long *)(lVar1 + -0x18);
        *(uint *)(&this->field_0x50 + lVar1) = *(uint *)(&this->field_0x50 + lVar1) & 0xfffffefb | 4
        ;
        poVar4 = std::operator<<(&this->label,0x20);
        *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 5;
        now.
        super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
        .time_.time_count_.value_ =
             (base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
              )((ulong)(uint)fVar9 | 0x100000000);
        poVar4 = ::detail::operator<<(poVar4,(print_bytes<float> *)&now);
        std::operator<<(poVar4,"/s");
        uVar8 = this->max;
      }
      if (uVar8 == 0) {
        std::__cxx11::stringbuf::str();
        show_unbounded(local_48,(string *)&now);
      }
      else {
        std::__cxx11::stringbuf::str();
        show(local_48,(string *)&now);
      }
      std::__cxx11::string::~string((string *)&now);
      return true;
    }
  }
  return false;
}

Assistant:

bool progress::update(boost::uint64_t delta, bool force) {
	
	if(!show_progress) {
		return false;
	}
	
	force = force || progress_cleared;
	
	value += delta;
	
	float status = 0.f;
	if(max) {
		status = float(std::min(value, max)) / float(max);
		status = float(size_t(1000.f * status)) * (1.f / 1000.f);
		if(!force && status == last_status) {
			return false;
		}
	}
	
	boost::uint64_t time;
	try {
		boost::posix_time::ptime now(boost::posix_time::microsec_clock::universal_time());
		time = boost::uint64_t((now - start_time).total_microseconds());
	} catch(...) {
		// this shouldn't happen, assume no time has passed
		time = last_time;
	}
	
	#if defined(_WIN32)
	const boost::uint64_t update_interval = 100000;
	#else
	const boost::uint64_t update_interval = 50000;
	#endif
	if(!force && time - last_time < update_interval) {
		return false;
	}
	
	last_time = time;
	last_status = status;
	
	if(!max) {
		status = std::fmod(float(time) * (1.f / 5000000.f), 2.f);
		if(status > 1.f) {
			status = 2.f - status;
		}
	}
	
	if(show_rate) {
		if(value >= 10 * 1024 && time > 0) {
			float rate = 1000000.f * float(value) / float(time);
			if(rate != last_rate) {
				last_rate = rate;
				label.str(std::string()); // clear the buffer
				label << std::right << std::fixed << std::setfill(' ') << std::setw(5)
				      << print_bytes(rate, 1) << "/s";
			}
		}
	}
	
	if(max) {
		show(status, label.str());
	} else {
		show_unbounded(status, label.str());
	}
	
	return true;
}